

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderPassCreateInfo2 *pass,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  bool bVar1;
  GenericStringRef<char> local_368;
  GenericStringRef<char> local_358;
  undefined1 local_348 [8];
  Value depth_stencil;
  undefined1 local_328 [8];
  Value resolve;
  undefined1 local_310 [4];
  uint32_t j_3;
  Value resolves;
  undefined1 local_2f0 [8];
  Value color;
  undefined1 local_2d8 [4];
  uint32_t j_2;
  Value colors;
  undefined1 local_2b8 [8];
  Value input;
  undefined1 local_2a0 [4];
  uint32_t j_1;
  Value inputs;
  uint local_27c;
  undefined1 local_278 [4];
  uint32_t j;
  Value preserves;
  GenericStringRef<char> local_258;
  GenericStringRef<char> local_248;
  undefined1 local_238 [8];
  Value p;
  VkSubpassDescription2 *sub;
  undefined1 local_218 [4];
  uint32_t i_3;
  GenericStringRef<char> local_208;
  GenericStringRef<char> local_1f8;
  GenericStringRef<char> local_1e8;
  GenericStringRef<char> local_1d8;
  GenericStringRef<char> local_1c8;
  GenericStringRef<char> local_1b8;
  GenericStringRef<char> local_1a8;
  GenericStringRef<char> local_198;
  GenericStringRef<char> local_188;
  undefined1 local_178 [8];
  Value att;
  VkAttachmentDescription2 *a;
  undefined1 local_158 [4];
  uint32_t i_2;
  uint local_144;
  GenericStringRef<char> local_140;
  GenericStringRef<char> local_130;
  GenericStringRef<char> local_120;
  GenericStringRef<char> local_110;
  GenericStringRef<char> local_100;
  GenericStringRef<char> local_f0;
  GenericStringRef<char> local_e0;
  GenericStringRef<char> local_d0;
  undefined1 local_c0 [8];
  Value dep;
  VkSubpassDependency2 *d;
  undefined1 local_a0 [4];
  uint32_t i_1;
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t i;
  Value view_masks;
  Value attachments;
  Value subpasses;
  Value deps;
  undefined1 local_38 [8];
  Value json_object;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkRenderPassCreateInfo2 *pass_local;
  
  json_object.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>
            ((GenericStringRef<char> *)((long)&deps.data_ + 8),(char (*) [6])"flags");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(StringRefType *)((long)&deps.data_ + 8),pass->flags,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&subpasses.data_ + 8),kArrayType);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&attachments.data_ + 8),kArrayType);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&view_masks.data_ + 8),kArrayType);
  if (pass->pCorrelatedViewMasks != (uint32_t *)0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_88,kArrayType);
    for (local_8c = 0; local_8c < pass->correlatedViewMaskCount; local_8c = local_8c + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_88,pass->pCorrelatedViewMasks[local_8c],alloc);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<20u>
              ((GenericStringRef<char> *)local_a0,(char (*) [20])"correlatedViewMasks");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,(StringRefType *)local_a0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_88,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_88);
  }
  if (pass->pDependencies != (VkSubpassDependency2 *)0x0) {
    for (d._4_4_ = 0; d._4_4_ < pass->dependencyCount; d._4_4_ = d._4_4_ + 1) {
      dep.data_.s.str = (Ch *)(pass->pDependencies + d._4_4_);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_c0,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<16u>
                (&local_d0,(char (*) [16])"dependencyFlags");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_d0,*(uint *)(dep.data_.s.str + 0x28),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                (&local_e0,(char (*) [14])"dstAccessMask");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_e0,*(uint *)(dep.data_.s.str + 0x24),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                (&local_f0,(char (*) [14])"srcAccessMask");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_f0,*(uint *)(dep.data_.s.str + 0x20),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                (&local_100,(char (*) [13])"dstStageMask");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_100,*(uint *)((long)&((dep.data_.o.members)->value).data_ + 0xc)
                 ,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                (&local_110,(char (*) [13])"srcStageMask");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_110,*(uint *)((long)&((dep.data_.o.members)->value).data_ + 8),
                 alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                (&local_120,(char (*) [11])"dstSubpass");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_120,((dep.data_.o.members)->value).data_.s.hashcode,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                (&local_130,(char (*) [11])"srcSubpass");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c0,&local_130,((dep.data_.o.members)->value).data_.s.length,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                (&local_140,(char (*) [11])"viewOffset");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_c0,&local_140,*(int *)(dep.data_.s.str + 0x2c),alloc);
      bVar1 = pnext_chain_add_json_value<VkSubpassDependency2,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)local_c0,(VkSubpassDependency2 *)dep.data_.o.members,alloc,
                         (DynamicStateInfo *)0x0);
      if (bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)((long)&subpasses.data_ + 8),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,alloc);
      }
      else {
        pass_local._7_1_ = 0;
      }
      local_144 = (uint)!bVar1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_c0);
      if (local_144 != 0) goto LAB_0014b34a;
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<13u>
              ((GenericStringRef<char> *)local_158,(char (*) [13])"dependencies");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,(StringRefType *)local_158,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)&subpasses.data_ + 8),alloc);
  }
  if (pass->pAttachments != (VkAttachmentDescription2 *)0x0) {
    for (a._4_4_ = 0; a._4_4_ < pass->attachmentCount; a._4_4_ = a._4_4_ + 1) {
      att.data_.s.str = (Ch *)(pass->pAttachments + a._4_4_);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_178,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_188,(char (*) [6])"flags");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_188,((att.data_.o.members)->value).data_.s.length,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_198,(char (*) [7])"format");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFormat>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_198,((att.data_.o.members)->value).data_.s.hashcode,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<12u>
                (&local_1a8,(char (*) [12])"finalLayout");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1a8,*(VkImageLayout *)(att.data_.s.str + 0x30),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                (&local_1b8,(char (*) [14])"initialLayout");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkImageLayout>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1b8,*(VkImageLayout *)(att.data_.s.str + 0x2c),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_1c8,(char (*) [7])"loadOp");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentLoadOp>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1c8,
                 *(VkAttachmentLoadOp *)((long)&((att.data_.o.members)->value).data_ + 0xc),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_1d8,(char (*) [8])"storeOp");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentStoreOp>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1d8,*(VkAttachmentStoreOp *)(att.data_.s.str + 0x20),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_1e8,(char (*) [8])"samples");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkSampleCountFlagBits>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1e8,
                 *(VkSampleCountFlagBits *)((long)&((att.data_.o.members)->value).data_ + 8),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                (&local_1f8,(char (*) [14])"stencilLoadOp");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentLoadOp>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1f8,*(VkAttachmentLoadOp *)(att.data_.s.str + 0x24),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<15u>
                (&local_208,(char (*) [15])"stencilStoreOp");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkAttachmentStoreOp>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_208,*(VkAttachmentStoreOp *)(att.data_.s.str + 0x28),alloc);
      bVar1 = pnext_chain_add_json_value<VkAttachmentDescription2,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)local_178,(VkAttachmentDescription2 *)att.data_.o.members,alloc,
                         (DynamicStateInfo *)0x0);
      if (bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)((long)&view_masks.data_ + 8),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_178,alloc);
      }
      else {
        pass_local._7_1_ = 0;
      }
      local_144 = (uint)!bVar1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_178);
      if (local_144 != 0) goto LAB_0014b34a;
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<12u>
              ((GenericStringRef<char> *)local_218,(char (*) [12])"attachments");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,(StringRefType *)local_218,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)&view_masks.data_ + 8),alloc);
  }
  for (sub._4_4_ = 0; sub._4_4_ < pass->subpassCount; sub._4_4_ = sub._4_4_ + 1) {
    p.data_.s.str = (Ch *)(pass->pSubpasses + sub._4_4_);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_238,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_248,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_238,&local_248,((p.data_.o.members)->value).data_.s.length,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<18u>
              (&local_258,(char (*) [18])"pipelineBindPoint");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkPipelineBindPoint>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_238,&local_258,((p.data_.o.members)->value).data_.s.hashcode,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<9u>
              ((GenericStringRef<char> *)((long)&preserves.data_ + 8),(char (*) [9])"viewMask");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_238,(StringRefType *)((long)&preserves.data_ + 8),
               *(uint *)((long)&((p.data_.o.members)->value).data_ + 8),alloc);
    if (*(long *)(p.data_.s.str + 0x50) != 0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_278,kArrayType);
      for (local_27c = 0; local_27c < *(uint *)(p.data_.s.str + 0x48); local_27c = local_27c + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_278,*(uint *)(*(long *)(p.data_.s.str + 0x50) + (ulong)local_27c * 4),
                   alloc);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<20u>
                ((GenericStringRef<char> *)((long)&inputs.data_ + 8),
                 (char (*) [20])"preserveAttachments");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_238,(StringRefType *)((long)&inputs.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_278,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_278);
    }
    if (*(long *)(p.data_.s.str + 0x20) == 0) {
LAB_0014af54:
      if (*(long *)(p.data_.s.str + 0x30) != 0) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_2d8,kArrayType);
        for (color.data_._12_4_ = 0; (uint)color.data_._12_4_ < *(uint *)(p.data_.s.str + 0x28);
            color.data_._12_4_ = color.data_._12_4_ + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)local_2f0);
          bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkAttachmentReference2 *)
                             (*(long *)(p.data_.s.str + 0x30) +
                             (ulong)(uint)color.data_._12_4_ * 0x20),alloc,(Value *)local_2f0);
          if (bVar1) {
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_2d8,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_2f0,alloc);
          }
          else {
            pass_local._7_1_ = 0;
          }
          local_144 = (uint)!bVar1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_2f0);
          if (local_144 != 0) goto LAB_0014b069;
        }
        rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                  ((GenericStringRef<char> *)((long)&resolves.data_ + 8),
                   (char (*) [17])"colorAttachments");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_238,(StringRefType *)((long)&resolves.data_ + 8),
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_2d8,alloc);
        local_144 = 0;
LAB_0014b069:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_2d8);
        if (local_144 != 0) goto LAB_0014b2a9;
      }
      if (*(long *)(p.data_.s.str + 0x38) != 0) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_310,kArrayType);
        for (resolve.data_._12_4_ = 0; (uint)resolve.data_._12_4_ < *(uint *)(p.data_.s.str + 0x28);
            resolve.data_._12_4_ = resolve.data_._12_4_ + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)local_328);
          bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkAttachmentReference2 *)
                             (*(long *)(p.data_.s.str + 0x38) +
                             (ulong)(uint)resolve.data_._12_4_ * 0x20),alloc,(Value *)local_328);
          if (bVar1) {
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_310,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_328,alloc);
          }
          else {
            pass_local._7_1_ = 0;
          }
          local_144 = (uint)!bVar1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_328);
          if (local_144 != 0) goto LAB_0014b19c;
        }
        rapidjson::GenericStringRef<char>::GenericStringRef<19u>
                  ((GenericStringRef<char> *)((long)&depth_stencil.data_ + 8),
                   (char (*) [19])"resolveAttachments");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_238,(StringRefType *)((long)&depth_stencil.data_ + 8),
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_310,alloc);
        local_144 = 0;
LAB_0014b19c:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_310);
        if (local_144 != 0) goto LAB_0014b2a9;
      }
      if (*(long *)(p.data_.s.str + 0x40) != 0) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_348);
        bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (*(VkAttachmentReference2 **)(p.data_.s.str + 0x40),alloc,
                           (Value *)local_348);
        if (bVar1) {
          rapidjson::GenericStringRef<char>::GenericStringRef<23u>
                    (&local_358,(char (*) [23])"depthStencilAttachment");
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_238,&local_358,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_348,alloc);
        }
        else {
          pass_local._7_1_ = 0;
        }
        local_144 = (uint)!bVar1;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_348);
        if (local_144 != 0) goto LAB_0014b2a9;
      }
      bVar1 = pnext_chain_add_json_value<VkSubpassDescription2,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)local_238,(VkSubpassDescription2 *)p.data_.o.members,alloc,
                         (DynamicStateInfo *)0x0);
      if (bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)((long)&attachments.data_ + 8),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_238,alloc);
        local_144 = 0;
      }
      else {
        pass_local._7_1_ = 0;
        local_144 = 1;
      }
    }
    else {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_2a0,kArrayType);
      for (input.data_._12_4_ = 0;
          (uint)input.data_._12_4_ < *(uint *)((long)&((p.data_.o.members)->value).data_ + 0xc);
          input.data_._12_4_ = input.data_._12_4_ + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_2b8);
        bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkAttachmentReference2 *)
                           (*(long *)(p.data_.s.str + 0x20) + (ulong)(uint)input.data_._12_4_ * 0x20
                           ),alloc,(Value *)local_2b8);
        if (bVar1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_2a0,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_2b8,alloc);
        }
        else {
          pass_local._7_1_ = 0;
        }
        local_144 = (uint)!bVar1;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_2b8);
        if (local_144 != 0) goto LAB_0014af36;
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                ((GenericStringRef<char> *)((long)&colors.data_ + 8),
                 (char (*) [17])"inputAttachments");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_238,(StringRefType *)((long)&colors.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_2a0,alloc);
      local_144 = 0;
LAB_0014af36:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_2a0);
      if (local_144 == 0) goto LAB_0014af54;
    }
LAB_0014b2a9:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_238);
    if (local_144 != 0) goto LAB_0014b34a;
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_368,(char (*) [10])"subpasses");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38,&local_368,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((long)&attachments.data_ + 8),alloc);
  bVar1 = pnext_chain_add_json_value<VkRenderPassCreateInfo2,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Value *)local_38,pass,alloc,(DynamicStateInfo *)0x0);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    operator=(json_object.data_.a.elements,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38);
    pass_local._7_1_ = 1;
    local_144 = 1;
  }
  else {
    pass_local._7_1_ = 0;
    local_144 = 1;
  }
LAB_0014b34a:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)((long)&view_masks.data_ + 8));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)((long)&attachments.data_ + 8));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)((long)&subpasses.data_ + 8));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return (bool)(pass_local._7_1_ & 1);
}

Assistant:

static bool json_value(const VkRenderPassCreateInfo2 &pass, Allocator &alloc, Value *out_value)
{
	Value json_object(kObjectType);
	json_object.AddMember("flags", pass.flags, alloc);

	Value deps(kArrayType);
	Value subpasses(kArrayType);
	Value attachments(kArrayType);

	if (pass.pCorrelatedViewMasks)
	{
		Value view_masks(kArrayType);
		for (uint32_t i = 0; i < pass.correlatedViewMaskCount; i++)
			view_masks.PushBack(pass.pCorrelatedViewMasks[i], alloc);
		json_object.AddMember("correlatedViewMasks", view_masks, alloc);
	}

	if (pass.pDependencies)
	{
		for (uint32_t i = 0; i < pass.dependencyCount; i++)
		{
			auto &d = pass.pDependencies[i];
			Value dep(kObjectType);
			dep.AddMember("dependencyFlags", d.dependencyFlags, alloc);
			dep.AddMember("dstAccessMask", d.dstAccessMask, alloc);
			dep.AddMember("srcAccessMask", d.srcAccessMask, alloc);
			dep.AddMember("dstStageMask", d.dstStageMask, alloc);
			dep.AddMember("srcStageMask", d.srcStageMask, alloc);
			dep.AddMember("dstSubpass", d.dstSubpass, alloc);
			dep.AddMember("srcSubpass", d.srcSubpass, alloc);
			dep.AddMember("viewOffset", d.viewOffset, alloc);
			if (!pnext_chain_add_json_value(dep, d, alloc, nullptr))
				return false;
			deps.PushBack(dep, alloc);
		}
		json_object.AddMember("dependencies", deps, alloc);
	}

	if (pass.pAttachments)
	{
		for (uint32_t i = 0; i < pass.attachmentCount; i++)
		{
			auto &a = pass.pAttachments[i];
			Value att(kObjectType);

			att.AddMember("flags", a.flags, alloc);
			att.AddMember("format", a.format, alloc);
			att.AddMember("finalLayout", a.finalLayout, alloc);
			att.AddMember("initialLayout", a.initialLayout, alloc);
			att.AddMember("loadOp", a.loadOp, alloc);
			att.AddMember("storeOp", a.storeOp, alloc);
			att.AddMember("samples", a.samples, alloc);
			att.AddMember("stencilLoadOp", a.stencilLoadOp, alloc);
			att.AddMember("stencilStoreOp", a.stencilStoreOp, alloc);
			if (!pnext_chain_add_json_value(att, a, alloc, nullptr))
				return false;
			attachments.PushBack(att, alloc);
		}
		json_object.AddMember("attachments", attachments, alloc);
	}

	for (uint32_t i = 0; i < pass.subpassCount; i++)
	{
		auto &sub = pass.pSubpasses[i];
		Value p(kObjectType);
		p.AddMember("flags", sub.flags, alloc);
		p.AddMember("pipelineBindPoint", sub.pipelineBindPoint, alloc);
		p.AddMember("viewMask", sub.viewMask, alloc);

		if (sub.pPreserveAttachments)
		{
			Value preserves(kArrayType);
			for (uint32_t j = 0; j < sub.preserveAttachmentCount; j++)
				preserves.PushBack(sub.pPreserveAttachments[j], alloc);
			p.AddMember("preserveAttachments", preserves, alloc);
		}

		if (sub.pInputAttachments)
		{
			Value inputs(kArrayType);
			for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
			{
				Value input;
				if (!json_value(sub.pInputAttachments[j], alloc, &input))
					return false;
				inputs.PushBack(input, alloc);
			}
			p.AddMember("inputAttachments", inputs, alloc);
		}

		if (sub.pColorAttachments)
		{
			Value colors(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value color;
				if (!json_value(sub.pColorAttachments[j], alloc, &color))
					return false;
				colors.PushBack(color, alloc);
			}
			p.AddMember("colorAttachments", colors, alloc);
		}

		if (sub.pResolveAttachments)
		{
			Value resolves(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value resolve;
				if (!json_value(sub.pResolveAttachments[j], alloc, &resolve))
					return false;
				resolves.PushBack(resolve, alloc);
			}
			p.AddMember("resolveAttachments", resolves, alloc);
		}

		if (sub.pDepthStencilAttachment)
		{
			Value depth_stencil;
			if (!json_value(*sub.pDepthStencilAttachment, alloc, &depth_stencil))
				return false;
			p.AddMember("depthStencilAttachment", depth_stencil, alloc);
		}

		if (!pnext_chain_add_json_value(p, sub, alloc, nullptr))
			return false;
		subpasses.PushBack(p, alloc);
	}
	json_object.AddMember("subpasses", subpasses, alloc);

	if (!pnext_chain_add_json_value(json_object, pass, alloc, nullptr))
		return false;

	*out_value = json_object;
	return true;
}